

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_iq2_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  undefined8 *puVar1;
  byte *pbVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  int *piVar22;
  uint16_t *puVar23;
  int i;
  long lVar24;
  float *pfVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  char *pcVar29;
  ushort uVar30;
  float *pfVar31;
  ulong uVar32;
  undefined8 uVar33;
  byte bVar34;
  int is;
  int iVar35;
  float *pfVar36;
  int i_1;
  ulong *puVar37;
  bool bVar38;
  short sVar39;
  anon_union_4_2_5fd15f10 fp32;
  undefined1 auVar44 [12];
  float fVar40;
  float fVar42;
  float fVar65;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar66;
  float fVar67;
  undefined1 auVar54 [16];
  undefined1 auVar63 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  int iVar71;
  int iVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar73;
  undefined1 auVar70 [16];
  float fVar74;
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [15];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  _Bool is_on_grid_aux [2];
  _Bool is_on_grid [2];
  int8_t Laux [16];
  int8_t L [16];
  float xval [16];
  float weight [16];
  float waux [16];
  float scales [16];
  ushort local_286;
  ushort local_284;
  undefined2 local_282;
  float local_280;
  float local_27c;
  long local_278;
  int local_26c;
  long local_268;
  ushort *local_260;
  float *local_258;
  void *local_250;
  float *local_248;
  float local_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  long local_210;
  float *local_208;
  float *local_200;
  long local_1f8;
  float *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  float *local_1d8;
  uint64_t *local_1d0;
  ulong local_1c8 [2];
  ulong local_1b8 [4];
  long local_198;
  int64_t local_190;
  long local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float local_158 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float afStack_f8 [32];
  float afStack_78 [18];
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 uVar41;
  undefined6 uVar43;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 uVar64;
  undefined1 auVar81 [16];
  
  local_250 = dst;
  local_208 = src;
  if ((char)n_per_row != '\0') {
    pcVar29 = "n_per_row%QK_K == 0";
    iVar35 = 0x1336;
LAB_0013ac60:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,iVar35,"GGML_ASSERT(%s) failed",pcVar29);
  }
  local_268 = n_per_row >> 8;
  if (0 < nrow) {
    local_1b8[3] = (n_per_row >> 8) * 0x52;
    local_210 = (long)dst + 0x22;
    lVar24 = 0;
    local_190 = nrow;
    local_1f0 = quant_weights;
    local_198 = n_per_row << 2;
    auVar75 = _DAT_0014e930;
    auVar83 = _DAT_0014e950;
    auVar84 = _DAT_0014e760;
    auVar85 = _DAT_0014e730;
    do {
      puVar23 = iq2_data[3].neighbours;
      piVar22 = iq2_data[3].map;
      if (iq2_data[3].map == (int *)0x0) {
        pcVar29 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0x1295;
        goto LAB_0013ac60;
      }
      local_188 = lVar24;
      local_1d0 = iq2_data[3].grid;
      if (iq2_data[3].grid == (uint64_t *)0x0) {
        pcVar29 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0x1296;
        goto LAB_0013ac60;
      }
      if (iq2_data[3].neighbours == (uint16_t *)0x0) {
        pcVar29 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0x1297;
        goto LAB_0013ac60;
      }
      if (0 < local_268) {
        local_1f8 = local_210;
        local_200 = quant_weights;
        lVar24 = 0;
        pfVar36 = local_208;
        do {
          local_180 = lVar24;
          lVar24 = lVar24 * 0x52;
          local_260 = (ushort *)((long)local_250 + lVar24);
          puVar1 = (undefined8 *)((long)local_250 + lVar24 + 0x40);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_250 + lVar24 + 0x30);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_250 + lVar24 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_250 + lVar24 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)local_250 + lVar24) = 0;
          ((undefined8 *)((long)local_250 + lVar24))[1] = 0;
          *(undefined2 *)((long)local_250 + lVar24 + 0x50) = 0;
          fVar76 = 0.0;
          lVar24 = 0;
          do {
            fVar76 = fVar76 + pfVar36[lVar24] * pfVar36[lVar24];
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x100);
          local_108 = (fVar76 + fVar76) * 0.00390625;
          uStack_104 = 0;
          uStack_100 = 0;
          uStack_fc = 0;
          local_118 = local_108;
          fStack_114 = local_108;
          fStack_110 = local_108;
          fStack_10c = local_108;
          local_280 = 0.0;
          uVar33 = 0;
          local_1e0 = local_1f8;
          local_1d8 = local_200;
          local_258 = pfVar36;
          lVar24 = 0;
          local_248 = pfVar36;
          do {
            local_278 = lVar24;
            if (quant_weights == (float *)0x0) {
              lVar24 = 0;
              do {
                pfVar31 = local_258 + lVar24;
                fVar76 = pfVar31[1];
                fVar42 = pfVar31[2];
                fVar67 = pfVar31[3];
                afStack_f8[lVar24] = local_118 * 0.25 + *pfVar31 * *pfVar31;
                afStack_f8[lVar24 + 1] = fStack_114 * 0.25 + fVar76 * fVar76;
                afStack_f8[lVar24 + 2] = fStack_110 * 0.25 + fVar42 * fVar42;
                afStack_f8[lVar24 + 3] = fStack_10c * 0.25 + fVar67 * fVar67;
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0x10);
            }
            else {
              lVar24 = 0;
              do {
                fVar76 = local_258[lVar24] * local_258[lVar24] + local_108;
                if (fVar76 < 0.0) {
                  local_228 = local_1d8[lVar24];
                  fVar76 = sqrtf(fVar76);
                  auVar75 = _DAT_0014e930;
                  auVar83 = _DAT_0014e950;
                  auVar84 = _DAT_0014e760;
                  auVar85 = _DAT_0014e730;
                  fVar42 = local_228;
                }
                else {
                  fVar76 = SQRT(fVar76);
                  fVar42 = local_1d8[lVar24];
                }
                afStack_f8[lVar24] = fVar42 * fVar76;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 0x10);
            }
            local_26c = ((uint)uVar33 & 3) * 2;
            lVar24 = 0;
            do {
              fVar76 = afStack_f8[lVar24];
              if (fVar76 < 0.0) {
                fVar76 = sqrtf(fVar76);
                auVar75 = _DAT_0014e930;
                auVar83 = _DAT_0014e950;
                auVar84 = _DAT_0014e760;
                auVar85 = _DAT_0014e730;
              }
              else {
                fVar76 = SQRT(fVar76);
              }
              afStack_f8[lVar24 + 0x10] = fVar76;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0x10);
            pfVar31 = local_158;
            pfVar25 = local_258;
            lVar24 = 0;
            do {
              lVar28 = 0;
              bVar34 = 0;
              do {
                fVar76 = pfVar25[lVar28];
                if (0.0 <= fVar76) {
                  pfVar31[lVar28] = fVar76;
                }
                else {
                  pfVar31[lVar28] = -fVar76;
                  bVar34 = bVar34 | (byte)(1 << ((byte)lVar28 & 0x1f));
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 != 8);
              *(byte *)((long)&local_286 + lVar24) = bVar34;
              pfVar31 = pfVar31 + 8;
              pfVar25 = pfVar25 + 8;
              bVar38 = lVar24 == 0;
              lVar24 = lVar24 + 1;
            } while (bVar38);
            lVar24 = 1;
            local_27c = local_158[0];
            do {
              if (local_27c <= local_158[lVar24]) {
                local_27c = local_158[lVar24];
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0x10);
            if (1e-08 <= local_27c) {
              local_1e8 = uVar33;
              _local_238 = ZEXT416((uint)(local_27c / 5.0));
              local_282 = 0x101;
              local_178 = ZEXT416(0x101);
              iVar35 = -9;
              _local_168 = (undefined1  [16])0x0;
              do {
                fVar74 = ((float)iVar35 * 0.1 + 5.0) / local_27c;
                local_23c = 1.0 / fVar74;
                pfVar36 = local_158;
                puVar37 = local_1c8;
                local_228 = fVar74;
                fStack_224 = fVar74;
                fStack_220 = fVar74;
                fStack_21c = fVar74;
                lVar24 = 0;
                fVar76 = fVar74;
                fVar42 = fVar74;
                fVar67 = fVar74;
                do {
                  lVar28 = 0;
                  do {
                    pfVar31 = pfVar36 + lVar28;
                    fVar40 = (*pfVar31 * fVar74 + -1.0) * 0.5 + 12582912.0;
                    fVar65 = (pfVar31[1] * fVar76 + -1.0) * 0.5 + 12582912.0;
                    auVar69._0_8_ = CONCAT44(fVar65,fVar40) & 0x7fffff007fffff;
                    auVar69._8_4_ =
                         (uint)((pfVar31[2] * fVar42 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar69._12_4_ =
                         (uint)((pfVar31[3] * fVar67 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    auVar68._0_4_ = -(uint)((int)((uint)fVar40 & 0x7fffff) < auVar83._0_4_);
                    auVar68._4_4_ = -(uint)((int)((uint)fVar65 & 0x7fffff) < auVar83._4_4_);
                    auVar68._8_4_ = -(uint)((int)auVar69._8_4_ < auVar83._8_4_);
                    auVar68._12_4_ = -(uint)((int)auVar69._12_4_ < auVar83._12_4_);
                    auVar69 = ~auVar68 & auVar83 | auVar69 & auVar68;
                    auVar45._0_4_ = -(uint)(auVar84._0_4_ < auVar69._0_4_);
                    auVar45._4_4_ = -(uint)(auVar84._4_4_ < auVar69._4_4_);
                    auVar45._8_4_ = -(uint)(auVar84._8_4_ < auVar69._8_4_);
                    auVar45._12_4_ = -(uint)(auVar84._12_4_ < auVar69._12_4_);
                    auVar69 = auVar45 & auVar69 & auVar85;
                    sVar7 = auVar69._0_2_;
                    cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar69[0] - (0xff < sVar7);
                    sVar7 = auVar69._2_2_;
                    sVar39 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar69[2] - (0xff < sVar7),
                                      cVar3);
                    sVar7 = auVar69._4_2_;
                    cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar69[4] - (0xff < sVar7);
                    sVar7 = auVar69._6_2_;
                    uVar41 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar69[6] - (0xff < sVar7),
                                      CONCAT12(cVar4,sVar39));
                    sVar7 = auVar69._8_2_;
                    cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar69[8] - (0xff < sVar7);
                    sVar7 = auVar69._10_2_;
                    uVar43 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar69[10] - (0xff < sVar7),
                                      CONCAT14(cVar5,uVar41));
                    sVar7 = auVar69._12_2_;
                    cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar69[0xc] - (0xff < sVar7);
                    sVar9 = auVar69._14_2_;
                    sVar7 = (short)((uint)uVar41 >> 0x10);
                    sVar8 = (short)((uint6)uVar43 >> 0x20);
                    sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] -
                                             (0xff < sVar9),CONCAT16(cVar6,uVar43)) >> 0x30);
                    *(uint *)((long)puVar37 + lVar28) =
                         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 -
                                                    (0xff < sVar7),
                                                    (0 < sVar39) * (sVar39 < 0x100) * cVar3 -
                                                    (0xff < sVar39))));
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 8);
                  uVar26 = local_1c8[lVar24];
                  uVar64 = (undefined1)(uVar26 >> 0x38);
                  auVar53._8_6_ = 0;
                  auVar53._0_8_ = uVar26;
                  auVar53[0xe] = uVar64;
                  auVar53[0xf] = uVar64;
                  uVar64 = (undefined1)(uVar26 >> 0x30);
                  auVar52._14_2_ = auVar53._14_2_;
                  auVar52._8_5_ = 0;
                  auVar52._0_8_ = uVar26;
                  auVar52[0xd] = uVar64;
                  auVar51._13_3_ = auVar52._13_3_;
                  auVar51._8_4_ = 0;
                  auVar51._0_8_ = uVar26;
                  auVar51[0xc] = uVar64;
                  uVar64 = (undefined1)(uVar26 >> 0x28);
                  auVar50._12_4_ = auVar51._12_4_;
                  auVar50._8_3_ = 0;
                  auVar50._0_8_ = uVar26;
                  auVar50[0xb] = uVar64;
                  auVar49._11_5_ = auVar50._11_5_;
                  auVar49._8_2_ = 0;
                  auVar49._0_8_ = uVar26;
                  auVar49[10] = uVar64;
                  uVar64 = (undefined1)(uVar26 >> 0x20);
                  auVar48._10_6_ = auVar49._10_6_;
                  auVar48[8] = 0;
                  auVar48._0_8_ = uVar26;
                  auVar48[9] = uVar64;
                  auVar47._9_7_ = auVar48._9_7_;
                  auVar47[8] = uVar64;
                  auVar47._0_8_ = uVar26;
                  uVar64 = (undefined1)(uVar26 >> 0x18);
                  auVar46._8_8_ = auVar47._8_8_;
                  auVar46[7] = uVar64;
                  auVar46[6] = uVar64;
                  uVar64 = (undefined1)(uVar26 >> 0x10);
                  auVar46[5] = uVar64;
                  auVar46[4] = uVar64;
                  uVar64 = (undefined1)(uVar26 >> 8);
                  auVar46[3] = uVar64;
                  auVar46[2] = uVar64;
                  auVar46[0] = (undefined1)uVar26;
                  auVar46[1] = auVar46[0];
                  auVar69 = psraw(auVar46,8);
                  iVar71 = piVar22[(ushort)(auVar69._14_2_ * auVar75._14_2_ |
                                            auVar69._6_2_ * auVar75._6_2_ |
                                            auVar69._10_2_ * auVar75._10_2_ |
                                            auVar69._2_2_ * auVar75._2_2_ |
                                           auVar69._12_2_ * auVar75._12_2_ |
                                           auVar69._4_2_ * auVar75._4_2_ |
                                           auVar69._8_2_ * auVar75._8_2_ |
                                           auVar69._0_2_ * auVar75._0_2_)];
                  *(undefined1 *)((long)&local_284 + lVar24) = 1;
                  if ((long)iVar71 < 0) {
                    *(undefined1 *)((long)&local_284 + lVar24) = 0;
                    iq2_find_best_neighbour
                              (puVar23 + (-1 - (long)iVar71),local_1d0,local_158 + lVar24 * 8,
                               afStack_f8 + lVar24 * 8 + 0x10,local_23c,
                               (int8_t *)(local_1c8 + lVar24));
                    auVar75 = _DAT_0014e930;
                    auVar83 = _DAT_0014e950;
                    auVar84 = _DAT_0014e760;
                    auVar85 = _DAT_0014e730;
                    fVar74 = local_228;
                    fVar76 = fStack_224;
                    fVar42 = fStack_220;
                    fVar67 = fStack_21c;
                  }
                  puVar37 = puVar37 + 1;
                  pfVar36 = pfVar36 + 8;
                  bVar38 = lVar24 == 0;
                  lVar24 = lVar24 + 1;
                } while (bVar38);
                fVar76 = 0.0;
                fVar42 = 0.0;
                fVar67 = 0.0;
                fVar74 = 0.0;
                lVar24 = 0;
                do {
                  fVar65 = (float)(*(char *)((long)local_1c8 + lVar24) * 2 + 1);
                  fVar40 = afStack_f8[lVar24];
                  fVar76 = fVar76 + fVar65 * local_158[lVar24] * fVar40;
                  fVar42 = fVar42 + fVar65 * fVar65 * fVar40;
                  fVar67 = fVar67 + fVar65 * fVar40 * 0.0;
                  fVar74 = fVar74 + fVar65 * fVar40 * 0.0;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 0x10);
                if ((0.0 < fVar42) && ((float)local_168._0_4_ * fVar42 < fVar76 * fVar76)) {
                  local_1b8[0] = local_1c8[0];
                  local_1b8[1] = local_1c8[1];
                  local_178 = ZEXT216(local_284);
                  local_238._4_4_ = fVar42;
                  local_238._0_4_ = fVar76 / fVar42;
                  fStack_230 = fVar67;
                  fStack_22c = fVar74;
                  local_168._4_4_ = fVar42;
                  local_168._0_4_ = fVar76 * (fVar76 / fVar42);
                  fStack_160 = fVar67;
                  fStack_15c = fVar74;
                }
                iVar35 = iVar35 + 1;
              } while (iVar35 != 10);
              local_282 = local_178._0_2_;
              auVar77 = local_178._0_15_ ^ DAT_0014e970._0_15_;
              auVar10[0xd] = 0;
              auVar10._0_13_ = auVar77._0_13_;
              auVar10[0xe] = auVar77[7];
              auVar11[0xc] = auVar77[6];
              auVar11._0_12_ = auVar77._0_12_;
              auVar11._13_2_ = auVar10._13_2_;
              auVar12[0xb] = 0;
              auVar12._0_11_ = auVar77._0_11_;
              auVar12._12_3_ = auVar11._12_3_;
              auVar13[10] = auVar77[5];
              auVar13._0_10_ = auVar77._0_10_;
              auVar13._11_4_ = auVar12._11_4_;
              auVar14[9] = 0;
              auVar14._0_9_ = auVar77._0_9_;
              auVar14._10_5_ = auVar13._10_5_;
              auVar15[8] = auVar77[4];
              auVar15._0_8_ = auVar77._0_8_;
              auVar15._9_6_ = auVar14._9_6_;
              auVar17._7_8_ = 0;
              auVar17._0_7_ = auVar15._8_7_;
              auVar18._8_7_ = 0;
              auVar18._0_8_ = SUB158(auVar17 << 0x40,7);
              auVar19._9_6_ = 0;
              auVar19._0_9_ = SUB159(auVar18 << 0x38,6);
              auVar20._10_5_ = 0;
              auVar20._0_10_ = SUB1510(auVar19 << 0x30,5);
              auVar21._11_4_ = 0;
              auVar21._0_11_ = SUB1511(auVar20 << 0x28,4);
              auVar16._3_12_ = SUB1512(auVar21 << 0x20,3);
              auVar16[2] = auVar77[1];
              uVar30 = CONCAT11(0,auVar77[0]);
              auVar16._0_2_ = uVar30;
              uVar27 = (uint)local_278;
              fVar76 = (float)local_238._0_4_;
              if (((auVar16._0_4_ >> 0x10) + (uint)uVar30 != 0) && (0.0 < (float)local_238._0_4_)) {
                fVar76 = 1.0 / (float)local_238._0_4_;
                pfVar36 = local_158;
                puVar37 = local_1b8;
                local_228 = fVar76;
                fStack_224 = fVar76;
                fStack_220 = fVar76;
                fStack_21c = fVar76;
                lVar24 = 0;
                fVar42 = fVar76;
                fVar67 = fVar76;
                fVar74 = fVar76;
                do {
                  if (*(char *)((long)&local_282 + lVar24) == '\0') {
                    uVar27 = 0;
                    uVar66 = 0;
                    lVar28 = 0;
                    iVar35 = 0;
                    iVar71 = 1;
                    iVar72 = 2;
                    iVar73 = 3;
                    do {
                      pfVar31 = pfVar36 + lVar28;
                      fVar40 = (*pfVar31 * fVar76 + -1.0) * 0.5 + 12582912.0;
                      fVar65 = (pfVar31[1] * fVar42 + -1.0) * 0.5 + 12582912.0;
                      auVar78._0_8_ = CONCAT44(fVar65,fVar40) & 0x7fffff007fffff;
                      auVar78._8_4_ =
                           (uint)((pfVar31[2] * fVar67 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar78._12_4_ =
                           (uint)((pfVar31[3] * fVar74 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar75._0_4_ = -(uint)((int)((uint)fVar40 & 0x7fffff) < auVar83._0_4_);
                      auVar75._4_4_ = -(uint)((int)((uint)fVar65 & 0x7fffff) < auVar83._4_4_);
                      auVar75._8_4_ = -(uint)((int)auVar78._8_4_ < auVar83._8_4_);
                      auVar75._12_4_ = -(uint)((int)auVar78._12_4_ < auVar83._12_4_);
                      auVar75 = ~auVar75 & auVar83 | auVar78 & auVar75;
                      auVar79._0_4_ = -(uint)(auVar84._0_4_ < auVar75._0_4_);
                      auVar79._4_4_ = -(uint)(auVar84._4_4_ < auVar75._4_4_);
                      auVar79._8_4_ = -(uint)(auVar84._8_4_ < auVar75._8_4_);
                      auVar79._12_4_ = -(uint)(auVar84._12_4_ < auVar75._12_4_);
                      auVar69 = ~auVar79 & auVar84 | auVar75 & auVar79;
                      auVar82._4_4_ = (int)(float)(iVar71 * 0x1000000 + 0x3f800000);
                      auVar82._12_4_ = (int)(float)(iVar73 * 0x1000000 + 0x3f800000);
                      auVar80._0_4_ = auVar69._0_4_ * (int)(float)(iVar35 * 0x1000000 + 0x3f800000);
                      auVar81._8_4_ =
                           (undefined4)
                           ((auVar69._8_8_ & 0xffffffff) *
                           (ulong)(uint)(int)(float)(iVar72 * 0x1000000 + 0x3f800000));
                      auVar81._4_4_ = auVar81._8_4_;
                      auVar81._0_4_ = auVar80._0_4_;
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      auVar81._12_4_ = (int)((auVar82._8_8_ & 0xffffffff) * (ulong)auVar69._12_4_);
                      auVar80._8_8_ = auVar81._8_8_;
                      auVar80._4_4_ = auVar82._4_4_ * auVar69._4_4_;
                      auVar69 = pshuflw(auVar80,auVar80,0xe8);
                      auVar69 = pshufhw(auVar69,auVar69,0xe8);
                      uVar27 = uVar27 | auVar69._0_4_;
                      uVar66 = uVar66 | auVar69._8_4_;
                      auVar75 = auVar75 & auVar79 & auVar85;
                      sVar7 = auVar75._0_2_;
                      cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar75[0] - (0xff < sVar7);
                      sVar7 = auVar75._2_2_;
                      sVar39 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar75[2] - (0xff < sVar7),
                                        cVar3);
                      sVar7 = auVar75._4_2_;
                      cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar75[4] - (0xff < sVar7);
                      sVar7 = auVar75._6_2_;
                      uVar41 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar75[6] - (0xff < sVar7),
                                        CONCAT12(cVar4,sVar39));
                      sVar7 = auVar75._8_2_;
                      cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar75[8] - (0xff < sVar7);
                      sVar7 = auVar75._10_2_;
                      uVar43 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar75[10] - (0xff < sVar7)
                                        ,CONCAT14(cVar5,uVar41));
                      sVar7 = auVar75._12_2_;
                      cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar75[0xc] - (0xff < sVar7);
                      sVar9 = auVar75._14_2_;
                      sVar7 = (short)((uint)uVar41 >> 0x10);
                      sVar8 = (short)((uint6)uVar43 >> 0x20);
                      sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar75[0xe] -
                                               (0xff < sVar9),CONCAT16(cVar6,uVar43)) >> 0x30);
                      *(uint *)((long)puVar37 + lVar28) =
                           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 -
                                                      (0xff < sVar7),
                                                      (0 < sVar39) * (sVar39 < 0x100) * cVar3 -
                                                      (0xff < sVar39))));
                      lVar28 = lVar28 + 4;
                      iVar35 = iVar35 + 4;
                      iVar71 = iVar71 + 4;
                      iVar72 = iVar72 + 4;
                      iVar73 = iVar73 + 4;
                    } while (lVar28 != 8);
                    if ((long)piVar22[(ushort)((ushort)((uVar66 | uVar27) >> 0x10) |
                                              (ushort)(uVar66 | uVar27))] < 0) {
                      iq2_find_best_neighbour
                                (puVar23 + (-1 - (long)piVar22[(ushort)((ushort)((uVar66 | uVar27)
                                                                                >> 0x10) |
                                                                       (ushort)(uVar66 | uVar27))]),
                                 local_1d0,local_158 + lVar24 * 8,afStack_f8 + lVar24 * 8 + 0x10,
                                 (float)local_238._0_4_,(int8_t *)(local_1b8 + lVar24));
                      auVar83 = _DAT_0014e950;
                      auVar84 = _DAT_0014e760;
                      auVar85 = _DAT_0014e730;
                      fVar76 = local_228;
                      fVar42 = fStack_224;
                      fVar67 = fStack_220;
                      fVar74 = fStack_21c;
                    }
                  }
                  puVar37 = puVar37 + 1;
                  pfVar36 = pfVar36 + 8;
                  bVar38 = lVar24 == 0;
                  lVar24 = lVar24 + 1;
                } while (bVar38);
                fVar76 = 0.0;
                fVar42 = 0.0;
                lVar24 = 0;
                do {
                  fVar67 = (float)(*(char *)((long)local_1b8 + lVar24) * 2 + 1);
                  fVar76 = fVar76 + fVar67 * fVar67 * afStack_f8[lVar24];
                  fVar42 = fVar42 + fVar67 * local_158[lVar24] * afStack_f8[lVar24];
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 0x10);
                uVar27 = (uint)local_278;
                auVar75 = _DAT_0014e930;
                fVar76 = (float)(~-(uint)(0.0 < fVar76) & local_238._0_4_ |
                                (uint)(fVar42 / fVar76) & -(uint)(0.0 < fVar76));
              }
              if (fVar76 < 0.0) {
                local_286 = ~local_286;
                fVar76 = -fVar76;
              }
              puVar37 = local_1b8;
              lVar24 = 0;
              do {
                uVar26 = *puVar37;
                uVar64 = (undefined1)(uVar26 >> 0x38);
                auVar61._8_6_ = 0;
                auVar61._0_8_ = uVar26;
                auVar61[0xe] = uVar64;
                auVar61[0xf] = uVar64;
                uVar64 = (undefined1)(uVar26 >> 0x30);
                auVar60._14_2_ = auVar61._14_2_;
                auVar60._8_5_ = 0;
                auVar60._0_8_ = uVar26;
                auVar60[0xd] = uVar64;
                auVar59._13_3_ = auVar60._13_3_;
                auVar59._8_4_ = 0;
                auVar59._0_8_ = uVar26;
                auVar59[0xc] = uVar64;
                uVar64 = (undefined1)(uVar26 >> 0x28);
                auVar58._12_4_ = auVar59._12_4_;
                auVar58._8_3_ = 0;
                auVar58._0_8_ = uVar26;
                auVar58[0xb] = uVar64;
                auVar57._11_5_ = auVar58._11_5_;
                auVar57._8_2_ = 0;
                auVar57._0_8_ = uVar26;
                auVar57[10] = uVar64;
                uVar64 = (undefined1)(uVar26 >> 0x20);
                auVar56._10_6_ = auVar57._10_6_;
                auVar56[8] = 0;
                auVar56._0_8_ = uVar26;
                auVar56[9] = uVar64;
                auVar55._9_7_ = auVar56._9_7_;
                auVar55[8] = uVar64;
                auVar55._0_8_ = uVar26;
                uVar64 = (undefined1)(uVar26 >> 0x18);
                auVar54._8_8_ = auVar55._8_8_;
                auVar54[7] = uVar64;
                auVar54[6] = uVar64;
                uVar64 = (undefined1)(uVar26 >> 0x10);
                auVar54[5] = uVar64;
                auVar54[4] = uVar64;
                uVar64 = (undefined1)(uVar26 >> 8);
                auVar54[3] = uVar64;
                auVar54[2] = uVar64;
                auVar54[0] = (undefined1)uVar26;
                auVar54[1] = auVar54[0];
                auVar69 = psraw(auVar54,8);
                auVar44._0_2_ = auVar69._0_2_ * auVar75._0_2_;
                auVar44._2_2_ = auVar69._2_2_ * auVar75._2_2_;
                auVar44._4_2_ = auVar69._4_2_ * auVar75._4_2_;
                auVar44._6_2_ = auVar69._6_2_ * auVar75._6_2_;
                auVar44._8_2_ = auVar69._8_2_ * auVar75._8_2_;
                auVar44._10_2_ = auVar69._10_2_ * auVar75._10_2_;
                auVar62._12_2_ = auVar69._12_2_ * auVar75._12_2_;
                auVar62._0_12_ = auVar44;
                auVar62._14_2_ = auVar69._14_2_ * auVar75._14_2_;
                auVar70._4_4_ = auVar62._12_4_;
                auVar70._0_4_ = auVar44._8_4_;
                auVar70._8_4_ = auVar44._8_4_;
                auVar70._12_4_ = auVar62._12_4_;
                uVar41 = SUB164(auVar70 | auVar62,4);
                auVar63._4_4_ = uVar41;
                auVar63._0_4_ = uVar41;
                auVar63._8_4_ = uVar41;
                auVar63._12_4_ = uVar41;
                auVar63 = auVar63 | auVar70 | auVar62;
                uVar66 = piVar22[(ushort)(auVar63._2_2_ | auVar63._0_2_)];
                if ((int)uVar66 < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar24 = 8;
                  do {
                    printf(" %d",(ulong)(uint)(int)(char)*puVar37);
                    puVar37 = (ulong *)((long)puVar37 + 1);
                    lVar24 = lVar24 + -1;
                  } while (lVar24 != 0);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
                             ,0x1319,"fatal error");
                }
                *(char *)(local_1e0 + -0x20 + lVar24) = (char)uVar66;
                pbVar2 = (byte *)((long)local_260 + (ulong)(uVar27 >> 1) + 0x42);
                *pbVar2 = *pbVar2 | (byte)((uVar66 >> 8) << ((byte)local_26c & 0x1f));
                *(undefined1 *)(local_1e0 + lVar24) = *(undefined1 *)((long)&local_286 + lVar24);
                lVar24 = lVar24 + 1;
                puVar37 = puVar37 + 1;
                local_26c = local_26c + 2;
              } while (lVar24 == 1);
              if (fVar76 < 0.0) {
                pcVar29 = "scale >= 0";
                iVar35 = 0x1320;
                goto LAB_0013ac60;
              }
              afStack_78[local_278] = fVar76;
              if (local_280 <= fVar76) {
                local_280 = fVar76;
              }
              uVar33 = local_1e8;
              quant_weights = local_1f0;
              pfVar36 = local_248;
            }
            else {
              afStack_78[local_278] = 0.0;
            }
            lVar24 = local_278 + 1;
            local_258 = local_258 + 0x10;
            local_1d8 = local_1d8 + 0x10;
            local_1e0 = local_1e0 + 2;
            uVar33 = CONCAT71((int7)((ulong)uVar33 >> 8),(char)uVar33 + '\x02');
          } while (lVar24 != 0x10);
          if ((local_280 != 0.0) || (NAN(local_280))) {
            fVar42 = (local_280 / 31.0) * 0.9875;
            fVar76 = (float)(((uint)fVar42 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar42 * 2) < 0x71000000) {
              fVar76 = 2.0;
            }
            fVar76 = fVar76 + ABS(fVar42) * 5.192297e+33 * 7.70372e-34;
            uVar30 = (SUB42(fVar76,0) & 0xfff) + ((ushort)((uint)fVar76 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar42 * 2)) {
              uVar30 = 0x7e00;
            }
            *local_260 = uVar30 | (ushort)((uint)fVar42 >> 0x10) & 0x8000;
            uVar26 = 0;
            do {
              uVar27 = (uint)((afStack_78[uVar26] * (1.0 / (local_280 / 31.0)) + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
              if (0x40000e < uVar27) {
                uVar27 = 0x40000f;
              }
              if (uVar27 < 0x400001) {
                uVar27 = 0;
              }
              uVar32 = uVar26 >> 1 & 0x7fffffff;
              if ((uVar26 & 1) == 0) {
                *(char *)((long)local_260 + uVar32 + 0x4a) = (char)uVar27;
              }
              else {
                pbVar2 = (byte *)((long)local_260 + uVar32 + 0x4a);
                *pbVar2 = *pbVar2 | (char)uVar27 << 4;
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != 0x10);
          }
          lVar24 = local_180 + 1;
          pfVar36 = pfVar36 + 0x100;
          local_200 = local_200 + 0x100;
          local_1f8 = local_1f8 + 0x52;
        } while (lVar24 != local_268);
      }
      local_250 = (void *)((long)local_250 + local_1b8[3]);
      lVar24 = local_188 + 1;
      local_208 = (float *)((long)local_208 + local_198);
      local_210 = local_210 + local_1b8[3];
      nrow = local_190;
    } while (lVar24 != local_190);
  }
  return nrow * local_268 * 0x52;
}

Assistant:

size_t quantize_iq2_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_s_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_s);
    }
    return nrow * nblock * sizeof(block_iq2_s);
}